

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O0

bool CivetServer::getParam(mg_connection *conn,char *name,string *dst,size_t occurrence)

{
  void *pvVar1;
  bool bVar2;
  mg_request_info *pmVar3;
  vector<char,std::allocator<char>> *this;
  size_type sVar4;
  size_t sVar5;
  bool local_889;
  bool get_param_success;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_880;
  const_iterator local_878;
  value_type_conflict1 local_86d [16];
  value_type_conflict1 local_85d;
  int local_85c;
  char local_858 [4];
  int r;
  char buf [2048];
  CivetConnection *conobj;
  CivetServer *me;
  mg_request_info *ri;
  char *queryString;
  char *formParams;
  size_t occurrence_local;
  string *dst_local;
  char *name_local;
  mg_connection *conn_local;
  
  queryString = (char *)0x0;
  ri = (mg_request_info *)0x0;
  name_local = (char *)conn;
  pmVar3 = mg_get_request_info(conn);
  pvVar1 = pmVar3->user_data;
  mg_lock_context(*(mg_context **)((long)pvVar1 + 8));
  this = (vector<char,std::allocator<char>> *)
         std::
         map<const_mg_connection_*,_CivetServer::CivetConnection,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
         ::operator[]((map<const_mg_connection_*,_CivetServer::CivetConnection,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
                       *)((long)pvVar1 + 0x10),(key_type *)&name_local);
  mg_unlock_context(*(mg_context **)((long)pvVar1 + 8));
  mg_lock_connection((mg_connection *)name_local);
  bVar2 = std::vector<char,_std::allocator<char>_>::empty
                    ((vector<char,_std::allocator<char>_> *)this);
  if (bVar2) {
    while (local_85c = mg_read((mg_connection *)name_local,local_858,0x800), local_85c != 0) {
      if ((local_85c < 0) ||
         (sVar4 = std::vector<char,_std::allocator<char>_>::size
                            ((vector<char,_std::allocator<char>_> *)this),
         0x200000 < sVar4 + (long)local_85c)) {
        local_86d[0] = '\0';
        std::vector<char,_std::allocator<char>_>::assign
                  ((vector<char,_std::allocator<char>_> *)this,1,local_86d);
        goto LAB_00117d7d;
      }
      local_880._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::end
                             ((vector<char,_std::allocator<char>_> *)this);
      __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
      __normal_iterator<char*>
                ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_878
                 ,&local_880);
      std::vector<char,std::allocator<char>>::insert<char*,void>
                (this,local_878,local_858,local_858 + local_85c);
    }
    local_85d = '\0';
    std::vector<char,_std::allocator<char>_>::push_back
              ((vector<char,_std::allocator<char>_> *)this,&local_85d);
  }
LAB_00117d7d:
  bVar2 = std::vector<char,_std::allocator<char>_>::empty
                    ((vector<char,_std::allocator<char>_> *)this);
  if (!bVar2) {
    queryString = std::vector<char,_std::allocator<char>_>::operator[]
                            ((vector<char,_std::allocator<char>_> *)this,0);
  }
  if (pmVar3->query_string != (char *)0x0) {
    ri = (mg_request_info *)pmVar3->query_string;
  }
  mg_unlock_connection((mg_connection *)name_local);
  local_889 = false;
  if (queryString != (char *)0x0) {
    sVar5 = strlen(queryString);
    local_889 = getParam(queryString,sVar5,name,dst,occurrence);
  }
  if ((local_889 == false) && (ri != (mg_request_info *)0x0)) {
    sVar5 = strlen((char *)ri);
    local_889 = getParam((char *)ri,sVar5,name,dst,occurrence);
  }
  return local_889;
}

Assistant:

bool
CivetServer::getParam(struct mg_connection *conn,
                      const char *name,
                      std::string &dst,
                      size_t occurrence)
{
	const char *formParams = NULL;
	const char *queryString = NULL;
	const struct mg_request_info *ri = mg_get_request_info(conn);
	assert(ri != NULL);
	CivetServer *me = (CivetServer *)(ri->user_data);
	assert(me != NULL);
	mg_lock_context(me->context);
	CivetConnection &conobj = me->connections[conn];
	mg_unlock_context(me->context);

	mg_lock_connection(conn);
	if (conobj.postData.empty()) {
		// check if there is a request body
		for (;;) {
			char buf[2048];
			int r = mg_read(conn, buf, sizeof(buf));
			try {
				if (r == 0) {
					conobj.postData.push_back('\0');
					break;
				} else if ((r < 0)
				           || ((conobj.postData.size() + r)
				               > MAX_PARAM_BODY_LENGTH)) {
					conobj.postData.assign(1, '\0');
					break;
				}
				conobj.postData.insert(conobj.postData.end(), buf, buf + r);
			} catch (...) {
				conobj.postData.clear();
				break;
			}
		}
	}
	if (!conobj.postData.empty()) {
		// check if form parameter are already stored
		formParams = &conobj.postData[0];
	}

	if (ri->query_string != NULL) {
		// get requests do store html <form> field values in the http
		// query_string
		queryString = ri->query_string;
	}

	mg_unlock_connection(conn);

	bool get_param_success = false;
	if (formParams != NULL) {
		get_param_success =
		    getParam(formParams, strlen(formParams), name, dst, occurrence);
	}
	if (!get_param_success && queryString != NULL) {
		get_param_success =
		    getParam(queryString, strlen(queryString), name, dst, occurrence);
	}

	return get_param_success;
}